

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::SetMixingColumnsForDeferredRows(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  PeelRow *pPVar5;
  uint64_t *puVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint ge_column_k;
  uint ge_column_j;
  uint ge_column_i;
  RowMixIterator mix;
  uint defer_count;
  uint64_t *ge_row;
  uint16_t defer_row_i;
  PeelRow *row;
  Codec *this_local;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  
  for (defer_row_i = this->_defer_head_rows; defer_row_i != 0xffff;
      defer_row_i = pPVar5[defer_row_i].NextRow) {
    pPVar5 = this->_peel_rows;
    pPVar5[defer_row_i].Marks.Unmarked[0] = 0xffff;
    puVar6 = this->_compress_matrix;
    uVar11 = this->_ge_pitch * (uint)defer_row_i;
    uVar9 = (uint)this->_defer_count;
    uVar1 = this->_mix_count;
    uVar2 = this->_mix_next_prime;
    uVar3 = pPVar5[defer_row_i].Params.MixFirst;
    x = uVar3;
    for (i = 1; i < 3; i = i + 1) {
      uVar4 = pPVar5[defer_row_i].Params.MixAdd;
      x = (uint16_t)((ulong)((uint)x + (uint)uVar4) % (ulong)(long)(int)(uint)uVar2);
      if (uVar1 <= x) {
        uVar7 = uVar2 - x;
        if (uVar4 < uVar7) {
          x = (uint16_t)(((uint)uVar4 * 0x10000 - (uint)uVar7) % (uint)uVar4);
        }
        else {
          x = uVar4 - uVar7;
        }
      }
      mix.Columns[i] = x;
    }
    uVar8 = uVar9 + uVar3;
    uVar10 = (ulong)(uVar8 >> 6);
    puVar6[uVar11 + uVar10] = 1L << ((byte)uVar8 & 0x3f) ^ puVar6[uVar11 + uVar10];
    uVar10 = (ulong)(uVar9 + mix.Columns[1] >> 6);
    puVar6[uVar11 + uVar10] =
         1L << ((byte)(uVar9 + mix.Columns[1]) & 0x3f) ^ puVar6[uVar11 + uVar10];
    uVar10 = (ulong)(uVar9 + mix.Columns[2] >> 6);
    puVar6[uVar11 + uVar10] =
         1L << ((byte)(uVar9 + mix.Columns[2]) & 0x3f) ^ puVar6[uVar11 + uVar10];
  }
  return;
}

Assistant:

void Codec::SetMixingColumnsForDeferredRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetMixingColumnsForDeferredRows ----" << endl << endl;)

    PeelRow * GF256_RESTRICT row;

    // For each deferred row:
    for (uint16_t defer_row_i = _defer_head_rows;
        defer_row_i != LIST_TERM;
        defer_row_i = row->NextRow)
    {
        row = &_peel_rows[defer_row_i];

        CAT_IF_DUMP(cout << "Deferred row " << defer_row_i << " set mix columns :";)

        // Mark it as deferred for the following loop
        row->Marks.Result.PeelColumn = LIST_TERM;

        // Set up mixing column generator
        uint64_t *ge_row = _compress_matrix + _ge_pitch * defer_row_i;

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k;)

        CAT_IF_DUMP(cout << endl;)
    }
}